

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.hpp
# Opt level: O2

int diy::io::utils::mkstemp(char *__template)

{
  size_t __n;
  int iVar1;
  char *__template_00;
  unique_ptr<char[],_std::default_delete<char[]>_> s_template;
  _Head_base<0UL,_char_*,_false> local_28;
  
  __n = *(size_t *)(__template + 8);
  __template_00 = (char *)operator_new__(__n + 1);
  local_28._M_head_impl = __template_00;
  if (__n != 0) {
    memmove(__template_00,*(void **)__template,__n);
  }
  __template_00[__n] = '\0';
  iVar1 = mkostemp(__template_00,0x101001);
  if (iVar1 != -1) {
    std::__cxx11::string::assign(__template);
  }
  std::unique_ptr<char[],_std::default_delete<char[]>_>::~unique_ptr
            ((unique_ptr<char[],_std::default_delete<char[]>_> *)&local_28);
  return iVar1;
}

Assistant:

inline int mkstemp(std::string& filename)
  {
#if defined(_WIN32)

    std::string path, name;
    detail::splitpath(filename, path, name);
    char temppath[MAX_PATH];
    // note: GetTempFileName only uses the first 3 chars of the prefix (name)
    // specified.
    if (GetTempFileName(path.c_str(), name.c_str(), 0, temppath) == 0)
    {
      // failed! return invalid handle.
      return -1;
    }
    int handle = -1;
    // _sopen_s sets handle to -1 on error.
    _sopen_s(&handle, temppath, _O_WRONLY | _O_CREAT | _O_BINARY, _SH_DENYNO, _S_IWRITE);
    if (handle != -1)
      filename = temppath;
    return handle;

#else // defined(_WIN32)

    std::unique_ptr<char[]> s_template(new char[filename.size() + 1]);
    std::copy(filename.begin(), filename.end(), s_template.get());
    s_template[filename.size()] = 0;

    int handle = -1;
#if defined(__MACH__) || defined(__ANDROID_API__)
    // TODO: figure out how to open with O_SYNC
    handle = ::mkstemp(s_template.get());
#else
    handle = mkostemp(s_template.get(), O_WRONLY | O_SYNC);
#endif
    if (handle != -1)
      filename = s_template.get();
    return handle;

#endif // defined(_WIN32)
  }